

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_tuple.hpp
# Opt level: O3

void __thiscall
burst::dynamic_tuple::dynamic_tuple<bool,int,void>(dynamic_tuple *this,bool *head,int *tail)

{
  char *pcVar1;
  int8_t *creation_place;
  
  this->m_capacity = 8;
  pcVar1 = (char *)operator_new__(8);
  pcVar1[0] = '\0';
  pcVar1[1] = '\0';
  pcVar1[2] = '\0';
  pcVar1[3] = '\0';
  pcVar1[4] = '\0';
  pcVar1[5] = '\0';
  pcVar1[6] = '\0';
  pcVar1[7] = '\0';
  (this->m_data)._M_t.super___uniq_ptr_impl<signed_char,_std::default_delete<signed_char[]>_>._M_t.
  super__Tuple_impl<0UL,_signed_char_*,_std::default_delete<signed_char[]>_>.
  super__Head_base<0UL,_signed_char_*,_false>._M_head_impl = pcVar1;
  (this->m_objects).
  super__Vector_base<burst::management::object_info_t,_std::allocator<burst::management::object_info_t>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->m_volume = 0;
  (this->m_objects).
  super__Vector_base<burst::management::object_info_t,_std::allocator<burst::management::object_info_t>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_objects).
  super__Vector_base<burst::management::object_info_t,_std::allocator<burst::management::object_info_t>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  push_back_no_realloc<bool>(this,head);
  creation_place = force_align<int>(this,tail);
  accomodate<int>(this,tail,creation_place);
  return;
}

Assistant:

explicit dynamic_tuple (Head && head, Tail && ... tail):
            m_capacity(aligned_volume_v<Head, Tail...>),
            m_data(std::make_unique<std::int8_t[]>(m_capacity))
        {
            try
            {
                push_back_no_realloc(std::forward<Head>(head));
                BURST_EXPAND_VARIADIC(push_back_no_realloc(std::forward<Tail>(tail)));
            }
            catch (...)
            {
                destroy_all();
                throw;
            }
        }